

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_16x64_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int8_t *piVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  __m256i *buf;
  __m256i *input_00;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i buf0 [64];
  __m256i buf1 [64];
  longlong local_1060 [320];
  longlong local_660 [198];
  
  piVar5 = av1_fwd_txfm_shift_ls[0x11];
  lVar9 = 0;
  do {
    uVar2 = *(undefined8 *)(input + 4);
    uVar3 = *(undefined8 *)(input + 8);
    uVar4 = *(undefined8 *)(input + 0xc);
    *(undefined8 *)((long)local_1060 + lVar9) = *(undefined8 *)input;
    *(undefined8 *)((long)local_1060 + lVar9 + 8) = uVar2;
    *(undefined8 *)((long)local_1060 + lVar9 + 0x10) = uVar3;
    *(undefined8 *)((long)local_1060 + lVar9 + 0x18) = uVar4;
    lVar9 = lVar9 + 0x20;
    input = input + stride;
  } while (lVar9 != 0x800);
  bVar1 = *av1_fwd_txfm_shift_ls[0x11];
  uVar8 = (uint)(char)bVar1;
  if ((int)uVar8 < 0) {
    auVar11._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar11._2_2_ = auVar11._0_2_;
    auVar11._4_2_ = auVar11._0_2_;
    auVar11._6_2_ = auVar11._0_2_;
    auVar11._8_2_ = auVar11._0_2_;
    auVar11._10_2_ = auVar11._0_2_;
    auVar11._12_2_ = auVar11._0_2_;
    auVar11._14_2_ = auVar11._0_2_;
    auVar11._16_2_ = auVar11._0_2_;
    auVar11._18_2_ = auVar11._0_2_;
    auVar11._20_2_ = auVar11._0_2_;
    auVar11._22_2_ = auVar11._0_2_;
    auVar11._24_2_ = auVar11._0_2_;
    auVar11._26_2_ = auVar11._0_2_;
    auVar11._28_2_ = auVar11._0_2_;
    auVar11._30_2_ = auVar11._0_2_;
    lVar9 = 0;
    do {
      auVar12 = vpaddsw_avx2(auVar11,*(undefined1 (*) [32])((long)local_1060 + lVar9));
      auVar12 = vpsraw_avx2(auVar12,ZEXT416(-uVar8));
      *(undefined1 (*) [32])((long)local_1060 + lVar9) = auVar12;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  else if (bVar1 != 0) {
    lVar9 = 0;
    do {
      auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar9),ZEXT416(uVar8));
      *(undefined1 (*) [32])((long)local_1060 + lVar9) = auVar11;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  fdct16x64_new_avx2((__m256i *)local_1060,(__m256i *)local_1060,'\r');
  bVar1 = piVar5[1];
  if ((char)bVar1 < '\0') {
    auVar12._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar12._2_2_ = auVar12._0_2_;
    auVar12._4_2_ = auVar12._0_2_;
    auVar12._6_2_ = auVar12._0_2_;
    auVar12._8_2_ = auVar12._0_2_;
    auVar12._10_2_ = auVar12._0_2_;
    auVar12._12_2_ = auVar12._0_2_;
    auVar12._14_2_ = auVar12._0_2_;
    auVar12._16_2_ = auVar12._0_2_;
    auVar12._18_2_ = auVar12._0_2_;
    auVar12._20_2_ = auVar12._0_2_;
    auVar12._22_2_ = auVar12._0_2_;
    auVar12._24_2_ = auVar12._0_2_;
    auVar12._26_2_ = auVar12._0_2_;
    auVar12._28_2_ = auVar12._0_2_;
    auVar12._30_2_ = auVar12._0_2_;
    lVar9 = 0;
    do {
      auVar11 = vpaddsw_avx2(auVar12,*(undefined1 (*) [32])((long)local_1060 + lVar9));
      auVar11 = vpsraw_avx2(auVar11,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_1060 + lVar9) = auVar11;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  else if (bVar1 != 0) {
    lVar9 = 0;
    do {
      auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_1060 + lVar9),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)local_1060 + lVar9) = auVar11;
      lVar9 = lVar9 + 0x20;
    } while (lVar9 != 0x800);
  }
  lVar9 = 0;
  do {
    transpose_16bit_16x16_avx2
              ((__m256i *)((long)local_1060 + lVar9),(__m256i *)((long)local_1060 + lVar9 + 0x800));
    lVar9 = lVar9 + 0x200;
  } while (lVar9 != 0x800);
  input_00 = (__m256i *)(local_1060 + 0x100);
  lVar9 = 0;
  bVar6 = true;
  do {
    bVar10 = bVar6;
    fdct16x16_new_avx2(input_00,input_00,'\f');
    bVar1 = piVar5[2];
    uVar8 = (uint)(char)bVar1;
    if ((int)uVar8 < 0) {
      auVar13._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar13._2_2_ = auVar13._0_2_;
      auVar13._4_2_ = auVar13._0_2_;
      auVar13._6_2_ = auVar13._0_2_;
      auVar13._8_2_ = auVar13._0_2_;
      auVar13._10_2_ = auVar13._0_2_;
      auVar13._12_2_ = auVar13._0_2_;
      auVar13._14_2_ = auVar13._0_2_;
      auVar13._16_2_ = auVar13._0_2_;
      auVar13._18_2_ = auVar13._0_2_;
      auVar13._20_2_ = auVar13._0_2_;
      auVar13._22_2_ = auVar13._0_2_;
      auVar13._24_2_ = auVar13._0_2_;
      auVar13._26_2_ = auVar13._0_2_;
      auVar13._28_2_ = auVar13._0_2_;
      auVar13._30_2_ = auVar13._0_2_;
      lVar7 = 0;
      do {
        auVar11 = vpaddsw_avx2(auVar13,*(undefined1 (*) [32])((long)*input_00 + lVar7));
        auVar11 = vpsraw_avx2(auVar11,ZEXT416(-uVar8));
        *(undefined1 (*) [32])((long)*input_00 + lVar7) = auVar11;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar7 = 0;
      do {
        auVar11 = vpsllw_avx2(*(undefined1 (*) [32])((long)*input_00 + lVar7),ZEXT416(uVar8));
        *(undefined1 (*) [32])((long)*input_00 + lVar7) = auVar11;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0x200);
    }
    lVar7 = 0;
    do {
      auVar11 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*input_00 + lVar7));
      auVar12 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)*input_00 + lVar7 + 0x10));
      *(undefined1 (*) [32])(output + lVar9 + lVar7) = auVar11;
      *(undefined1 (*) [32])(output + lVar9 + lVar7 + 8) = auVar12;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x200);
    lVar9 = 0x10;
    input_00 = (__m256i *)local_660;
    bVar6 = false;
  } while (bVar10);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x64_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_16X64;
  __m256i buf0[64], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = fdct16x64_new_avx2;
  const transform_1d_avx2 row_txfm = fdct16x16_new_avx2;
  const int width_div16 = (width >> 4);
  const int height_div16 = (height >> 4);

  for (int i = 0; i < width_div16; i++) {
    load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    for (int j = 0; j < height_div16; ++j) {
      transpose_16bit_16x16_avx2(buf0 + j * 16, buf1 + j * width + 16 * i);
    }
  }

  for (int i = 0; i < AOMMIN(2, height_div16); i++) {
    __m256i *buf = buf1 + width * i;
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + width * i, 32, width);
  }
}